

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeSupport(DdNode *bFunc,Vec_Str_t *vSupport,int nVars)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  
  if (vSupport->nCap < nVars) {
    if (vSupport->pArray == (char *)0x0) {
      pcVar2 = (char *)malloc((long)nVars);
    }
    else {
      pcVar2 = (char *)realloc(vSupport->pArray,(long)nVars);
    }
    vSupport->pArray = pcVar2;
    vSupport->nCap = nVars;
  }
  vSupport->nSize = nVars;
  if (nVars < 1) {
    Abc_NodeSupport_rec(bFunc,vSupport);
    Abc_NodeSupportClear_rec(bFunc);
  }
  else {
    lVar3 = 0;
    do {
      vSupport->pArray[lVar3] = '\0';
      lVar3 = lVar3 + 1;
    } while (lVar3 < vSupport->nSize);
    Abc_NodeSupport_rec(bFunc,vSupport);
    Abc_NodeSupportClear_rec(bFunc);
    if (0 < nVars) {
      uVar4 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + vSupport->pArray[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)nVars != uVar4);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int Abc_NodeSupport( DdNode * bFunc, Vec_Str_t * vSupport, int nVars )
{
    int Counter, i;
    // compute the support by marking the BDD
    Vec_StrFill( vSupport, nVars, 0 );
    Abc_NodeSupport_rec( bFunc, vSupport );
    // clear the marak
    Abc_NodeSupportClear_rec( bFunc );
    // get the number of support variables
    Counter = 0;
    for ( i = 0; i < nVars; i++ )
        Counter += vSupport->pArray[i];
    return Counter;
}